

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int GetCoeffsFast(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  ulong *puVar1;
  ulong uVar2;
  VP8BandProbas *pVVar3;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  VP8ProbaArray *p;
  range_t rVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  
  if (n < 0x10) {
    p = prob[n]->probas_ + ctx;
    do {
      bVar9 = (*p)[0];
      rVar12 = br->range_;
      if (br->bits_ < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits_ = br->bits_ + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar10 = bVar9 * rVar12 >> 8;
      bVar9 = (byte)br->bits_;
      uVar8 = (uint)(br->value_ >> (bVar9 & 0x3f));
      if (uVar10 < uVar8) {
        uVar14 = rVar12 - uVar10;
        br->value_ = br->value_ - ((ulong)uVar10 + 1 << (bVar9 & 0x3f));
      }
      else {
        uVar14 = uVar10 + 1;
      }
      uVar4 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      br->bits_ = br->bits_ - (uVar4 ^ 7);
      br->range_ = (uVar14 << ((byte)(uVar4 ^ 7) & 0x1f)) - 1;
      if (uVar8 <= uVar10) {
        return n;
      }
      lVar11 = (long)n;
      lVar15 = lVar11 << 0x20;
      while( true ) {
        n = n + 1;
        bVar9 = (*p)[1];
        rVar12 = br->range_;
        if (br->bits_ < 0) {
          puVar1 = (ulong *)br->buf_;
          if (puVar1 < br->buf_max_) {
            uVar2 = *puVar1;
            br->buf_ = (uint8_t *)((long)puVar1 + 7);
            br->value_ = br->value_ << 0x38 |
                         ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                          (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >>
                         8;
            br->bits_ = br->bits_ + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        uVar10 = bVar9 * rVar12 >> 8;
        bVar9 = (byte)br->bits_;
        uVar8 = (uint)(br->value_ >> (bVar9 & 0x3f));
        if (uVar10 < uVar8) {
          uVar14 = rVar12 - uVar10;
          br->value_ = br->value_ - ((ulong)uVar10 + 1 << (bVar9 & 0x3f));
        }
        else {
          uVar14 = uVar10 + 1;
        }
        uVar4 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        iVar7 = br->bits_ - (uVar4 ^ 7);
        rVar12 = (uVar14 << ((byte)(uVar4 ^ 7) & 0x1f)) - 1;
        br->bits_ = iVar7;
        br->range_ = rVar12;
        if (uVar10 < uVar8) break;
        p = (VP8ProbaArray *)prob[lVar11 + 1];
        lVar11 = lVar11 + 1;
        lVar15 = lVar15 + 0x100000000;
        if (lVar11 == 0x10) {
          return 0x10;
        }
      }
      pVVar3 = prob[n];
      bVar9 = (*p)[2];
      if (iVar7 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits_ = iVar7 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar10 = bVar9 * rVar12 >> 8;
      bVar9 = (byte)br->bits_;
      uVar8 = (uint)(br->value_ >> (bVar9 & 0x3f));
      if (uVar10 < uVar8) {
        uVar14 = rVar12 - uVar10;
        br->value_ = br->value_ - ((ulong)uVar10 + 1 << (bVar9 & 0x3f));
      }
      else {
        uVar14 = uVar10 + 1;
      }
      uVar4 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      br->bits_ = br->bits_ - (uVar4 ^ 7);
      br->range_ = (uVar14 << ((byte)(uVar4 ^ 7) & 0x1f)) - 1;
      if (uVar10 < uVar8) {
        iVar7 = GetLargeValue(br,*p);
        uVar6 = (ushort)iVar7;
        lVar13 = 0x16;
      }
      else {
        uVar6 = 1;
        lVar13 = 0xb;
      }
      if (br->bits_ < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits_ = br->bits_ + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      p = (VP8ProbaArray *)(pVVar3->probas_[0] + lVar13);
      uVar8 = br->range_ >> 1;
      bVar9 = (byte)br->bits_;
      iVar7 = uVar8 - (int)(br->value_ >> (bVar9 & 0x3f));
      uVar10 = iVar7 >> 0x1f;
      br->bits_ = br->bits_ + -1;
      br->range_ = br->range_ + uVar10 | 1;
      br->value_ = br->value_ - ((ulong)(uVar8 + 1 & uVar10) << (bVar9 & 0x3f));
      uVar5 = (ushort)(iVar7 >> 0x1f);
      out[""[lVar15 >> 0x20]] = ((uVar6 ^ uVar5) - uVar5) * (short)dq[0 < lVar11];
    } while (lVar11 < 0xf);
  }
  return 0x10;
}

Assistant:

static int GetCoeffsFast(VP8BitReader* const br,
                         const VP8BandProbas* const prob[],
                         int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas_[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBit(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBit(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas_[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas_[0];
      int v;
      if (!VP8GetBit(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}